

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloatExpanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  deUint64 dVar1;
  bool bVar2;
  long lVar3;
  deUint64 dVar4;
  StateQueryMemoryWriteGuard<long> state;
  Hex<16UL> local_1c0;
  StateQueryMemoryWriteGuard<long> local_1b8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1b8.m_postguard = -0x2121212121212122;
  local_1b8.m_preguard = -0x2121212121212122;
  local_1b8.m_value = 0xdededededededede;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1b8.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    (&local_1b8,testCtx);
  if (bVar2) {
    lVar3 = (long)((reference * 4.2949673e+09 + -1.0) * 0.5);
    dVar1 = lVar3 + 0x7ff;
    dVar4 = lVar3 - 0x7ff;
    if (local_1b8.m_value < (long)dVar4 || (long)dVar1 < local_1b8.m_value) {
      local_1a0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected in range [",0x1d);
      local_1c0.value = dVar4;
      tcu::Format::Hex<16UL>::toStream(&local_1c0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
      local_1c0.value = dVar1;
      tcu::Format::Hex<16UL>::toStream(&local_1c0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]; got ",7);
      local_1c0.value = local_1b8.m_value;
      tcu::Format::Hex<16UL>::toStream(&local_1c0,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloatExpanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	DE_ASSERT(de::inRange(reference, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 expectedGLStateMax = expandGLFloatToInteger(reference) + FLOAT_EXPANSION_E_64;
	const GLint64 expectedGLStateMin = expandGLFloatToInteger(reference) - FLOAT_EXPANSION_E_64;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << toHex(expectedGLStateMin) << "," << toHex(expectedGLStateMax) << "]; got " << toHex((GLint64)state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}